

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O1

bool __thiscall ASDCP::UL::MatchIgnorePlaceholder(UL *this,UL *rhs)

{
  byte_t bVar1;
  
  if (((((((((this->super_Identifier<16U>).m_Value[0] == (rhs->super_Identifier<16U>).m_Value[0]) &&
           ((this->super_Identifier<16U>).m_Value[1] == (rhs->super_Identifier<16U>).m_Value[1])) &&
          ((this->super_Identifier<16U>).m_Value[2] == (rhs->super_Identifier<16U>).m_Value[2])) &&
         ((this->super_Identifier<16U>).m_Value[3] == (rhs->super_Identifier<16U>).m_Value[3])) &&
        ((((bVar1 = (this->super_Identifier<16U>).m_Value[4], bVar1 == '\x7f' ||
           (bVar1 == (rhs->super_Identifier<16U>).m_Value[4])) &&
          ((bVar1 = (this->super_Identifier<16U>).m_Value[5], bVar1 == '\x7f' ||
           (bVar1 == (rhs->super_Identifier<16U>).m_Value[5])))) &&
         ((bVar1 = (this->super_Identifier<16U>).m_Value[6], bVar1 == '\x7f' ||
          (bVar1 == (rhs->super_Identifier<16U>).m_Value[6])))))) &&
       (((bVar1 = (this->super_Identifier<16U>).m_Value[8], bVar1 == '\x7f' ||
         (bVar1 == (rhs->super_Identifier<16U>).m_Value[8])) &&
        (((bVar1 = (this->super_Identifier<16U>).m_Value[9], bVar1 == '\x7f' ||
          (bVar1 == (rhs->super_Identifier<16U>).m_Value[9])) &&
         ((bVar1 = (this->super_Identifier<16U>).m_Value[10], bVar1 == '\x7f' ||
          (bVar1 == (rhs->super_Identifier<16U>).m_Value[10])))))))) &&
      (((bVar1 = (this->super_Identifier<16U>).m_Value[0xb], bVar1 == '\x7f' ||
        (bVar1 == (rhs->super_Identifier<16U>).m_Value[0xb])) &&
       ((bVar1 = (this->super_Identifier<16U>).m_Value[0xc], bVar1 == '\x7f' ||
        (bVar1 == (rhs->super_Identifier<16U>).m_Value[0xc])))))) &&
     (((bVar1 = (this->super_Identifier<16U>).m_Value[0xd], bVar1 == '\x7f' ||
       (bVar1 == (rhs->super_Identifier<16U>).m_Value[0xd])) &&
      ((bVar1 = (this->super_Identifier<16U>).m_Value[0xe], bVar1 == '\x7f' ||
       (bVar1 == (rhs->super_Identifier<16U>).m_Value[0xe])))))) {
    bVar1 = (this->super_Identifier<16U>).m_Value[0xf];
    if (bVar1 == '\x7f') {
      return true;
    }
    if (bVar1 == (rhs->super_Identifier<16U>).m_Value[0xf]) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
ASDCP::UL::MatchIgnorePlaceholder(const UL& rhs) const
{
  if ( m_Value[0] == rhs.m_Value[0] &&
       m_Value[1] == rhs.m_Value[1] &&
       m_Value[2] == rhs.m_Value[2] &&
       m_Value[3] == rhs.m_Value[3] &&
       ( m_Value[4] == 0x7f || m_Value[4] == rhs.m_Value[4] ) &&
       ( m_Value[5] == 0x7f || m_Value[5] == rhs.m_Value[5] ) &&
       ( m_Value[6] == 0x7f || m_Value[6] == rhs.m_Value[6] ) &&
       //       m_Value[7] == rhs.m_Value[7] &&  // version is ignored when performing lookups
       ( m_Value[8] == 0x7f || m_Value[8] == rhs.m_Value[8] ) &&
       ( m_Value[9] == 0x7f || m_Value[9] == rhs.m_Value[9] ) &&
       ( m_Value[10] == 0x7f || m_Value[10] == rhs.m_Value[10] ) &&
       ( m_Value[11] == 0x7f || m_Value[11] == rhs.m_Value[11] ) &&
       ( m_Value[12] == 0x7f || m_Value[12] == rhs.m_Value[12] ) &&
       ( m_Value[13] == 0x7f || m_Value[13] == rhs.m_Value[13] ) &&
       ( m_Value[14] == 0x7f || m_Value[14] == rhs.m_Value[14] ) &&
       ( m_Value[15] == 0x7f || m_Value[15] == rhs.m_Value[15] )
       )
    return true;

  return false;
}